

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_append_final_resp(Curl_easy *data,int imapcode,imapstate instate)

{
  undefined4 local_1c;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  Curl_easy *data_local;
  
  local_1c = CURLE_OK;
  if (imapcode == 1) {
    imap_state(data,IMAP_STOP);
  }
  else {
    local_1c = CURLE_UPLOAD_FAILED;
  }
  return local_1c;
}

Assistant:

static CURLcode imap_state_append_final_resp(struct Curl_easy *data,
                                             int imapcode,
                                             imapstate instate)
{
  CURLcode result = CURLE_OK;

  (void)instate; /* No use for this yet */

  if(imapcode != IMAP_RESP_OK)
    result = CURLE_UPLOAD_FAILED;
  else
    /* End of DONE phase */
    imap_state(data, IMAP_STOP);

  return result;
}